

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Player.cpp
# Opt level: O2

int __thiscall
Player::executeAttack
          (Player *this,Country *fromCountry,Country *toCountry,Player *defendingPlayer,
          int numAttackingDice,int numDefendingDice)

{
  int iVar1;
  int *piVar2;
  vector<Map::Country_*,_std::allocator<Map::Country_*>_> *pvVar3;
  __type _Var4;
  int iVar5;
  ostream *poVar6;
  reference ppCVar7;
  GameLoop *pGVar8;
  int iVar9;
  long lVar10;
  ulong __n;
  string local_a0;
  vector<int,_std::allocator<int>_> defendingRolls;
  vector<int,_std::allocator<int>_> attackingRolls;
  string local_50;
  
  DiceRoller::roll(&attackingRolls,this->pDiceRoller,numAttackingDice);
  DiceRoller::roll(&defendingRolls,defendingPlayer->pDiceRoller,numDefendingDice);
  poVar6 = std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  poVar6 = std::operator<<(poVar6," - ");
  Map::Country::getCountryName_abi_cxx11_(&local_a0,fromCountry);
  poVar6 = std::operator<<(poVar6,(string *)&local_a0);
  poVar6 = std::operator<<(poVar6," is attacking ");
  Map::Country::getCountryName_abi_cxx11_(&local_50,toCountry);
  poVar6 = std::operator<<(poVar6,(string *)&local_50);
  poVar6 = std::operator<<(poVar6," - ");
  std::endl<char,std::char_traits<char>>(poVar6);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_a0);
  do {
    while( true ) {
      if ((attackingRolls.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start ==
           attackingRolls.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish) ||
         (defendingRolls.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start ==
          defendingRolls.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish)) {
        setPlayerState(this,IDLE);
        goto LAB_0010a71b;
      }
      iVar1 = attackingRolls.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish[-1];
      attackingRolls.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = attackingRolls.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish + -1;
      iVar5 = defendingRolls.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish[-1];
      defendingRolls.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = defendingRolls.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish + -1;
      poVar6 = std::operator<<((ostream *)&std::cout,"\nAttacker rolled a ");
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,iVar1);
      poVar6 = std::operator<<(poVar6,". Defender rolled a ");
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,iVar5);
      poVar6 = std::operator<<(poVar6,".");
      std::endl<char,std::char_traits<char>>(poVar6);
      if (iVar5 < iVar1) break;
      poVar6 = std::operator<<((ostream *)&std::cout,"\nAttacker lost 1 army!");
      std::endl<char,std::char_traits<char>>(poVar6);
      *fromCountry->pNumberOfTroops = *fromCountry->pNumberOfTroops + -1;
    }
    poVar6 = std::operator<<((ostream *)&std::cout,"\n[DEFENDER] Defender lost 1 army!");
    std::endl<char,std::char_traits<char>>(poVar6);
    piVar2 = toCountry->pNumberOfTroops;
    *piVar2 = *piVar2 + -1;
  } while (*piVar2 != 0);
  poVar6 = std::operator<<((ostream *)&std::cout,
                           "\n[DEFENDER] Defender has lost possession of country ");
  Map::Country::getCountryName_abi_cxx11_(&local_a0,toCountry);
  poVar6 = std::operator<<(poVar6,(string *)&local_a0);
  std::endl<char,std::char_traits<char>>(poVar6);
  std::__cxx11::string::~string((string *)&local_a0);
  *toCountry->pPlayerOwnerId = *this->pPlayerId;
  lVar10 = 0;
  for (__n = 0; pvVar3 = defendingPlayer->pOwnedCountries,
      __n < (ulong)((long)(pvVar3->
                          super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>).
                          _M_impl.super__Vector_impl_data._M_finish -
                    (long)(pvVar3->
                          super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>).
                          _M_impl.super__Vector_impl_data._M_start >> 3); __n = __n + 1) {
    ppCVar7 = std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>::at(pvVar3,__n);
    Map::Country::getCountryName_abi_cxx11_(&local_a0,*ppCVar7);
    Map::Country::getCountryName_abi_cxx11_(&local_50,toCountry);
    _Var4 = std::operator==(&local_a0,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_a0);
    if (_Var4) {
      pvVar3 = this->pOwnedCountries;
      ppCVar7 = std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>::at
                          (defendingPlayer->pOwnedCountries,__n);
      std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>::push_back(pvVar3,ppCVar7);
      std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>::erase
                (defendingPlayer->pOwnedCountries,
                 (Country **)
                 (lVar10 + (long)(defendingPlayer->pOwnedCountries->
                                 super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>
                                 )._M_impl.super__Vector_impl_data._M_start));
      goto LAB_0010a879;
    }
    lVar10 = lVar10 + 8;
  }
  setPlayerState(this,IDLE);
  iVar1 = -1;
  goto LAB_0010a71d;
  while( true ) {
    poVar6 = std::operator<<((ostream *)&std::cout,"\nInvalid number! Try again.");
    std::endl<char,std::char_traits<char>>(poVar6);
    if ((0 < iVar5) && (iVar5 < *fromCountry->pNumberOfTroops)) break;
LAB_0010a879:
    pGVar8 = GameLoop::getInstance();
    Deck::draw(pGVar8->gameDeck,this->pCards);
    poVar6 = std::operator<<((ostream *)&std::cout,
                             "\n[ATTACKER] How many armies do you want to place on your new country?(1 to "
                            );
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,*fromCountry->pNumberOfTroops + -1);
    std::operator<<(poVar6,")");
    iVar5 = (*this->strategy->_vptr_PlayerStrategy[1])(this->strategy,4);
    iVar1 = *fromCountry->pNumberOfTroops;
    iVar9 = iVar1 - iVar5;
    if ((0 < iVar5 && (iVar9 != 0 && iVar5 <= iVar1)) &&
       (((byte)std::__cxx11::wstring::resize[*(long *)(std::cin + -0x18)] & 5) == 0)) {
      *fromCountry->pNumberOfTroops = iVar9;
      *toCountry->pNumberOfTroops = iVar5;
      break;
    }
  }
  setPlayerState(this,IDLE);
LAB_0010a71b:
  iVar1 = 1;
LAB_0010a71d:
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&defendingRolls.super__Vector_base<int,_std::allocator<int>_>);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&attackingRolls.super__Vector_base<int,_std::allocator<int>_>);
  return iVar1;
}

Assistant:

int
Player::executeAttack(Map::Country *fromCountry, Map::Country *toCountry, Player *defendingPlayer, int numAttackingDice,
                      int numDefendingDice) {
    /*
     * 1. The attacking player rolls 1-3 dice, having +1 army than dice rolled. 1 dice roll per attacking army.
     * 2. Defender rolls 2 dice, 1 for each army defending
     * 3. Compare highest dice rolls per army, defender wins ties. lower number loses army
     * 4. If the defending country loses all its armies, the attacking country has to place
     * at least 1 of the attacking armies on the conquered country, up to all but one army
     */

    // Roll
    std::vector<int> attackingRolls = this->getDiceRoller()->roll(numAttackingDice);
    std::vector<int> defendingRolls = defendingPlayer->getDiceRoller()->roll(numDefendingDice);
    std::cout << std::endl << " - " << fromCountry->getCountryName() << " is attacking " << toCountry->getCountryName() << " - "<<std::endl;

    // Compare the rolls, decide who wins and change number of armies of each country. Maybe update if attacking wins
    while (!attackingRolls.empty() && !defendingRolls.empty()) {
        int aRoll = attackingRolls.back();
        int dRoll = defendingRolls.back();
        attackingRolls.pop_back();
        defendingRolls.pop_back();
        std::cout << "\nAttacker rolled a " << aRoll << ". Defender rolled a " << dRoll << "." << std::endl;
        if (aRoll > dRoll) {
            // defender loses 1 army
            std::cout << "\n[DEFENDER] Defender lost 1 army!" << std::endl;
            toCountry->setNumberOfTroops(toCountry->getNumberOfTroops() - 1);
            // then, if no armies left on defending country, attacking player conquers it
            if (toCountry->getNumberOfTroops() == 0) {
                std::cout << "\n[DEFENDER] Defender has lost possession of country " << toCountry->getCountryName()
                          << std::endl;
                if (!exchangeCountryOwnership(*this, defendingPlayer, *toCountry)) {
                    this->setPlayerState(PlayerState::IDLE);
                    return PlayerAction::FAILED;
                } else {
                    int newArmies = 0;
                    do {
                        GameLoop::getInstance()->getGameDeck()->draw(*this->getCards());
                        cout << "\n[ATTACKER] How many armies do you want to place on your new country?(1 to "
                             << fromCountry->getNumberOfTroops() - 1 << ")";
                        newArmies = strategy->intInput(StrategyContext::ATTACK_NEW_ARMY_COUNT);
                        if (newArmies > fromCountry->getNumberOfTroops() - 1 || newArmies < 1 || cin.fail() || isnan(newArmies)) {
                            cout << "\nInvalid number! Try again." << std::endl;
                            continue;
                        } else {
                            fromCountry->setNumberOfTroops(fromCountry->getNumberOfTroops() - newArmies);
                            toCountry->setNumberOfTroops(newArmies);
                            break;
                        }
                    } while (newArmies > fromCountry->getNumberOfTroops() - 1 || newArmies < 1);
                    this->setPlayerState(PlayerState::IDLE);
                    return PlayerAction::SUCCEEDED;
                }
            }
        } else {
            // attacker loses 1 army
            std::cout << "\nAttacker lost 1 army!" << std::endl;
            fromCountry->setNumberOfTroops(fromCountry->getNumberOfTroops() - 1);
        }
    }
    this->setPlayerState(PlayerState::IDLE);
    return PlayerAction::SUCCEEDED;
}